

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O3

void __thiscall sznet::net::KcpConnection::handleKcpMessage(KcpConnection *this,Buffer *inputBuffer)

{
  Buffer *this_00;
  uint uVar1;
  char *buffer;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_ff8 [4016];
  char *local_48 [4];
  Timestamp local_28;
  Buffer *local_20;
  
  ikcp_input(this->m_kcp,
             (inputBuffer->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start + inputBuffer->m_readerIndex,
             inputBuffer->m_writerIndex - inputBuffer->m_readerIndex);
  kcpUpdateManual(this);
  buffer = (this->m_inputBuffer).m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start + (this->m_inputBuffer).m_writerIndex;
  uVar1 = ikcp_recv(this->m_kcp,buffer,
                    *(int *)&(this->m_inputBuffer).m_buffer.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish - (int)buffer);
  if ((int)uVar1 < 0) {
    if (uVar1 < 0xfffffffe) {
      file_00._8_8_ = 0x11;
      file_00.m_data = "KcpConnection.cpp";
      Logger::Logger((Logger *)local_ff8,file_00,0x187,ERROR);
      if (0x25 < (uint)((int)local_48 - (int)local_48[0])) {
        builtin_strncpy(local_48[0],"ikcp_recv recv buffer size not enough",0x25);
        local_48[0] = local_48[0] + 0x25;
      }
    }
    else {
      if (0 < g_logLevel) {
        return;
      }
      file._8_8_ = 0x11;
      file.m_data = "KcpConnection.cpp";
      Logger::Logger((Logger *)local_ff8,file,0x183,TRACE,"handleKcpMessage");
      if (0x11 < (uint)((int)local_48 - (int)local_48[0])) {
        builtin_strncpy(local_48[0],"ikcp_recv EAGAIN ",0x11);
        local_48[0] = local_48[0] + 0x11;
      }
    }
    Logger::~Logger((Logger *)local_ff8);
  }
  else {
    this_00 = &this->m_inputBuffer;
    Buffer::hasWritten(this_00,(ulong)uVar1);
    std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<sznet::net::KcpConnection,void>
              ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)local_ff8,
               (__weak_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    local_28 = Timestamp::now();
    local_20 = this_00;
    if ((this->m_kcpMessageCallback).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->m_kcpMessageCallback)._M_invoker)
              ((_Any_data *)&this->m_kcpMessageCallback,
               (shared_ptr<sznet::net::KcpConnection> *)local_ff8,&local_20,&local_28);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ff8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_ff8._8_8_);
    }
  }
  return;
}

Assistant:

void KcpConnection::handleKcpMessage(Buffer& inputBuffer)
{
	long readSize = static_cast<long>(inputBuffer.readableBytes());
	ikcp_input(m_kcp, inputBuffer.peek(), readSize);
	kcpUpdateManual();
	int bufferSize = static_cast<int>(m_inputBuffer.writableBytes());
	int recvRet = ikcp_recv(m_kcp, m_inputBuffer.beginWrite(), bufferSize);
	if (recvRet < 0)
	{
		// https://github.com/skywind3000/kcp/issues/39
		// -1 ������ȫû�����ݣ����������� EAGAIN
		// -2 �������ݲ�ȫ����Ҫ�������ݲ�����Ϊһ������������Ҳ���������� EAGAIN
		// -3 �����㴫���Ļ��泤�Ȳ���
		if (recvRet == -1 || recvRet == -2)
		{
			LOG_TRACE << "ikcp_recv EAGAIN ";
		}
		else
		{
			LOG_ERROR << "ikcp_recv recv buffer size not enough";
		}
		return;
	}
	m_inputBuffer.hasWritten(static_cast<size_t>(recvRet));
	// ��������
	m_kcpMessageCallback(shared_from_this(), &m_inputBuffer, Timestamp::now());
}